

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

size_t perfetto::base::SerializeCrashKeys(char *dst,size_t len)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 *puVar4;
  size_t sVar5;
  
  uVar3 = (ulong)(anonymous_namespace)::g_num_keys;
  if ((len == 0) || (*dst = '\0', uVar3 == 0)) {
    sVar5 = 0;
  }
  else {
    puVar4 = &(anonymous_namespace)::g_keys;
    uVar2 = 1;
    sVar5 = 0;
    do {
      if ((CrashKey *)*puVar4 != (CrashKey *)0x0) {
        sVar1 = CrashKey::ToString((CrashKey *)*puVar4,dst + sVar5,len - sVar5);
        sVar5 = sVar5 + sVar1;
      }
      if (uVar3 <= uVar2) {
        return sVar5;
      }
      puVar4 = puVar4 + 1;
      uVar2 = uVar2 + 1;
    } while (sVar5 < len);
  }
  return sVar5;
}

Assistant:

OptionalStorage(OptionalStorage&& other) noexcept(
      std::is_nothrow_move_constructible<T>::value) {
    if (other.is_populated_)
      Init(std::move(other.value_));
  }